

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O3

int Cmd_RunAutoTunerEval(Vec_Ptr_t *vAigs,satoko_opts_t *pOpts,int nProcs)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  void *__dest;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long *plVar7;
  int iVar8;
  pthread_t *__newthread;
  ulong uVar9;
  Cmd_AutoData_t ThData [100];
  pthread_t WorkerThread [100];
  long local_fd8 [2];
  undefined4 local_fc8;
  undefined8 local_fc4;
  int local_fbc [793];
  pthread_t local_358 [101];
  
  if (nProcs == 1) {
    iVar3 = Cmd_RunAutoTunerEvalSimple(vAigs,pOpts);
    return iVar3;
  }
  if (nProcs - 2U < 100) {
    uVar6 = (ulong)(nProcs - 1);
    __newthread = local_358;
    plVar7 = local_fd8;
    uVar9 = 0;
    do {
      *plVar7 = 0;
      plVar7[1] = (long)pOpts;
      *(int *)(plVar7 + 2) = (int)uVar9;
      *(undefined8 *)((long)plVar7 + 0x14) = 0xffffffff;
      *(undefined4 *)((long)plVar7 + 0x1c) = 0xffffffff;
      iVar3 = pthread_create(__newthread,(pthread_attr_t *)0x0,Cmd_RunAutoTunerEvalWorkerThread,
                             plVar7);
      if (iVar3 != 0) {
        __assert_fail("status == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                      ,0xab,"int Cmd_RunAutoTunerEval(Vec_Ptr_t *, satoko_opts_t *, int)");
      }
      uVar9 = uVar9 + 1;
      __newthread = __newthread + 1;
      plVar7 = plVar7 + 4;
    } while (uVar6 != uVar9);
    uVar1 = vAigs->nSize;
    uVar9 = (ulong)uVar1;
    iVar3 = 0;
    if ((long)vAigs->nCap == 0) {
      __dest = (void *)0x0;
    }
    else {
      __dest = malloc((long)vAigs->nCap << 3);
    }
    memcpy(__dest,vAigs->pArray,(long)(int)uVar1 << 3);
    do {
      bVar2 = 0 < (int)uVar9;
      uVar5 = uVar6;
      plVar7 = local_fd8;
      do {
        if ((int)plVar7[3] == 0) {
          if (*plVar7 != 0) {
            if (*(int *)((long)plVar7 + 0x1c) < 0) {
              __assert_fail("ThData[i].Result >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                            ,0xbd,"int Cmd_RunAutoTunerEval(Vec_Ptr_t *, satoko_opts_t *, int)");
            }
            iVar3 = iVar3 + *(int *)((long)plVar7 + 0x1c);
            *plVar7 = 0;
          }
          iVar8 = (int)uVar9;
          if (iVar8 == 0) {
            uVar9 = 0;
          }
          else {
            if (iVar8 < 1) {
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x2d2,"void *Vec_PtrPop(Vec_Ptr_t *)");
            }
            uVar9 = (ulong)(iVar8 - 1);
            *plVar7 = *(long *)((long)__dest + uVar9 * 8);
            *(undefined4 *)(plVar7 + 3) = 1;
          }
        }
        else {
          bVar2 = true;
        }
        plVar7 = plVar7 + 4;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    } while (bVar2);
    if (__dest != (void *)0x0) {
      free(__dest);
    }
    lVar4 = 0;
    do {
      if (*(int *)((long)local_fbc + lVar4 + -4) != 0) {
        __assert_fail("!ThData[i].fWorking",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                      ,0xcd,"int Cmd_RunAutoTunerEval(Vec_Ptr_t *, satoko_opts_t *, int)");
      }
      *(undefined8 *)((long)local_fd8 + lVar4) = 0;
      *(undefined4 *)((long)local_fbc + lVar4 + -4) = 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar6 << 5 != lVar4);
    return iVar3;
  }
  __assert_fail("nProcs >= 1 && nProcs <= CMD_THR_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                ,0xa1,"int Cmd_RunAutoTunerEval(Vec_Ptr_t *, satoko_opts_t *, int)");
}

Assistant:

int Cmd_RunAutoTunerEval( Vec_Ptr_t * vAigs, satoko_opts_t * pOpts, int nProcs )
{
    Cmd_AutoData_t ThData[CMD_THR_MAX];
    pthread_t WorkerThread[CMD_THR_MAX];
    int i, status, fWorkToDo = 1, TotalCost = 0;
    Vec_Ptr_t * vStack;
    if ( nProcs == 1 )
        return Cmd_RunAutoTunerEvalSimple( vAigs, pOpts );
    // subtract manager thread
    nProcs--;
    assert( nProcs >= 1 && nProcs <= CMD_THR_MAX );
    // start threads
    for ( i = 0; i < nProcs; i++ )
    {
        ThData[i].pGia     = NULL;
        ThData[i].pOpts    = pOpts;
        ThData[i].iThread  = i;
        ThData[i].nTimeOut = -1;
        ThData[i].fWorking = 0;
        ThData[i].Result   = -1;
        status = pthread_create( WorkerThread + i, NULL,Cmd_RunAutoTunerEvalWorkerThread, (void *)(ThData + i) );  assert( status == 0 );
    }
    // look at the threads
    vStack = Vec_PtrDup(vAigs);
    while ( fWorkToDo )
    {
        fWorkToDo = (int)(Vec_PtrSize(vStack) > 0);
        for ( i = 0; i < nProcs; i++ )
        {
            // check if this thread is working
            if ( ThData[i].fWorking )
            {
                fWorkToDo = 1;
                continue;
            }
            // check if this thread has recently finished
            if ( ThData[i].pGia != NULL )
            {
                assert( ThData[i].Result >= 0 );
                TotalCost += ThData[i].Result;
                ThData[i].pGia = NULL;
            }
            if ( Vec_PtrSize(vStack) == 0 )
                continue;
            // give this thread a new job
            assert( ThData[i].pGia == NULL );
            ThData[i].pGia = (Gia_Man_t *)Vec_PtrPop( vStack );
            ThData[i].fWorking = 1;
        }
    }
    Vec_PtrFree( vStack );
    // stop threads
    for ( i = 0; i < nProcs; i++ )
    {
        assert( !ThData[i].fWorking );
        // stop
        ThData[i].pGia = NULL;
        ThData[i].fWorking = 1;
    }
    return TotalCost;
}